

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall YAML::Parser::ParseDirectives(Parser *this)

{
  TYPE TVar1;
  bool bVar2;
  Token *token;
  Directives *this_00;
  bool bVar3;
  
  bVar3 = false;
  do {
    bVar2 = Scanner::empty((this->m_pScanner)._M_t.
                           super___uniq_ptr_impl<YAML::Scanner,_std::default_delete<YAML::Scanner>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_YAML::Scanner_*,_std::default_delete<YAML::Scanner>_>
                           .super__Head_base<0UL,_YAML::Scanner_*,_false>._M_head_impl);
    if (bVar2) {
      return;
    }
    token = Scanner::peek((this->m_pScanner)._M_t.
                          super___uniq_ptr_impl<YAML::Scanner,_std::default_delete<YAML::Scanner>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_YAML::Scanner_*,_std::default_delete<YAML::Scanner>_>
                          .super__Head_base<0UL,_YAML::Scanner_*,_false>._M_head_impl);
    TVar1 = token->type;
    if (TVar1 == DIRECTIVE) {
      if (!bVar3) {
        this_00 = (Directives *)operator_new(0x40);
        Directives::Directives(this_00);
        std::__uniq_ptr_impl<YAML::Directives,_std::default_delete<YAML::Directives>_>::reset
                  ((__uniq_ptr_impl<YAML::Directives,_std::default_delete<YAML::Directives>_> *)
                   &this->m_pDirectives,this_00);
      }
      HandleDirective(this,token);
      Scanner::pop((this->m_pScanner)._M_t.
                   super___uniq_ptr_impl<YAML::Scanner,_std::default_delete<YAML::Scanner>_>._M_t.
                   super__Tuple_impl<0UL,_YAML::Scanner_*,_std::default_delete<YAML::Scanner>_>.
                   super__Head_base<0UL,_YAML::Scanner_*,_false>._M_head_impl);
      bVar3 = true;
    }
  } while (TVar1 == DIRECTIVE);
  return;
}

Assistant:

void Parser::ParseDirectives() {
  bool readDirective = false;

  while (!m_pScanner->empty()) {
    Token& token = m_pScanner->peek();
    if (token.type != Token::DIRECTIVE) {
      break;
    }

    // we keep the directives from the last document if none are specified;
    // but if any directives are specific, then we reset them
    if (!readDirective) {
      m_pDirectives.reset(new Directives);
    }

    readDirective = true;
    HandleDirective(token);
    m_pScanner->pop();
  }
}